

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

int __thiscall
ctemplate_htmlparser::HtmlparserCppTest::NameToId
          (HtmlparserCppTest *this,IdNameMap *list,string *name)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  
  if (list == (IdNameMap *)0x0) {
    pcVar2 = "list != NULL";
  }
  else {
    for (ppcVar3 = &list->name; *ppcVar3 != (char *)0x0; ppcVar3 = ppcVar3 + 2) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        return ((IdNameMap *)(ppcVar3 + -1))->id;
      }
    }
    pcVar2 = "false";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
  exit(1);
}

Assistant:

int HtmlparserCppTest::NameToId(const struct IdNameMap *list,
                                const string &name) {
  CHECK(list != NULL);
  while (list->name) {
    if (name.compare(list->name) == 0) {
      return list->id;
    }
    list++;
  }
  LOG(FATAL) << "Unknown name";
}